

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzerSettings.cpp
# Opt level: O3

char * __thiscall ModbusAnalyzerSettings::SaveSettings(ModbusAnalyzerSettings *this)

{
  char *pcVar1;
  SimpleArchive text_archive;
  SimpleArchive aSStack_18 [8];
  
  SimpleArchive::SimpleArchive(aSStack_18);
  SimpleArchive::operator<<(aSStack_18,"ModbusAnalyzerSettings");
  SimpleArchive::operator<<(aSStack_18,&this->mInputChannel);
  SimpleArchive::operator<<(aSStack_18,this->mBitRate);
  SimpleArchive::operator<<(aSStack_18,this->mInverted);
  SimpleArchive::operator<<(aSStack_18,this->mModbusMode);
  SimpleArchive::operator<<(aSStack_18,this->mParity);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(aSStack_18);
  return pcVar1;
}

Assistant:

const char* ModbusAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    text_archive << "ModbusAnalyzerSettings";
    text_archive << mInputChannel;
    text_archive << mBitRate;
    // text_archive << mBitsPerTransfer;
    // text_archive << mStopBits;
    // text_archive << mParity;
    // text_archive << mShiftOrder;
    text_archive << mInverted;

    // text_archive << mUseAutobaud;

    text_archive << mModbusMode;

    // added for 1.2.14
    text_archive << mParity;

    return SetReturnString( text_archive.GetString() );
}